

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

LoopEvent rec_for(jit_State *J,BCIns *fori,int isforl)

{
  byte bVar1;
  ushort uVar2;
  BCIns *J_00;
  TRef TVar3;
  int dir;
  LoopEvent LVar4;
  IRType local_b8;
  uint local_b4;
  undefined1 local_b0 [4];
  BCReg i;
  ScEvEntry scev;
  ushort local_90;
  TRef idx;
  IRType t;
  TRef stop;
  LoopEvent ev;
  IROp op;
  TRef *tr;
  TValue *tv;
  BCReg ra;
  int isforl_local;
  BCIns *fori_local;
  jit_State *J_local;
  BCIns *local_50;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  BCIns *local_40;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  BCIns *local_30;
  undefined2 local_26;
  undefined2 local_24;
  undefined2 local_22;
  BCIns *local_20;
  IRRef1 local_16;
  IRRef1 local_14;
  ushort local_12;
  jit_State *local_10;
  
  tv._0_4_ = *fori >> 8 & 0xff;
  tr = (TRef *)(J->L->base + (uint)tv);
  _ev = J->base + (uint)tv;
  tv._4_4_ = isforl;
  _ra = fori;
  fori_local = (BCIns *)J;
  if (isforl == 0) {
    lj_meta_for(J->L,(TValue *)tr);
    if ((*_ev & 0x1f000000) == 0x13000000) {
      local_b8 = lj_opt_narrow_forl((jit_State *)fori_local,(cTValue *)tr);
    }
    else {
      local_b8 = IRT_NUM;
    }
    local_90 = (ushort)local_b8;
    for (local_b4 = 0; J_00 = fori_local, local_b4 < 3; local_b4 = local_b4 + 1) {
      if (_ev[local_b4] == 0) {
        sload((jit_State *)fori_local,(uint)tv + local_b4);
      }
      if ((_ev[local_b4] & 0x1f000000) == 0x4000000) {
        local_20 = fori_local;
        local_22 = 0x5e8e;
        local_24 = (undefined2)_ev[local_b4];
        local_26 = 0;
        *(undefined2 *)(fori_local + 0x2f) = 0x5e8e;
        *(undefined2 *)(fori_local + 0x2e) = local_24;
        *(undefined2 *)((long)fori_local + 0xba) = 0;
        TVar3 = lj_opt_fold((jit_State *)fori_local);
        _ev[local_b4] = TVar3;
      }
      if (local_b8 == IRT_INT) {
        if (4 < (_ev[local_b4] >> 0x18 & 0x1f) - 0xf) {
          local_30 = fori_local;
          local_32 = 0x5b93;
          local_34 = (undefined2)_ev[local_b4];
          local_36 = 0x326e;
          *(undefined2 *)(fori_local + 0x2f) = 0x5b93;
          *(undefined2 *)(fori_local + 0x2e) = local_34;
          *(undefined2 *)((long)fori_local + 0xba) = 0x326e;
          TVar3 = lj_opt_fold((jit_State *)fori_local);
          _ev[local_b4] = TVar3;
        }
      }
      else if ((_ev[local_b4] & 0x1f000000) != 0xe000000) {
        local_40 = fori_local;
        local_42 = 0x5b0e;
        local_44 = (undefined2)_ev[local_b4];
        local_46 = 0x1d3;
        *(undefined2 *)(fori_local + 0x2f) = 0x5b0e;
        *(undefined2 *)(fori_local + 0x2e) = local_44;
        *(undefined2 *)((long)fori_local + 0xba) = 0x1d3;
        TVar3 = lj_opt_fold((jit_State *)fori_local);
        _ev[local_b4] = TVar3;
      }
    }
    _ev[3] = *_ev;
    idx = _ev[1];
    dir = rec_for_direction((cTValue *)(tr + 4));
    rec_for_check((jit_State *)J_00,local_b8,dir,idx,_ev[2],1);
  }
  else {
    scev._20_4_ = *_ev;
    if (((BCIns *)(J->scev).pc.ptr64 == fori) && ((scev._20_4_ & 0xffff) == (uint)(J->scev).idx)) {
      bVar1 = (J->scev).t.irt;
      uVar2 = (J->scev).stop;
      local_12 = bVar1 | 0x2900;
      local_14 = (IRRef1)scev._20_4_;
      local_16 = (J->scev).step;
      (J->fold).ins.field_0.ot = local_12;
      (J->fold).ins.field_0.op1 = local_14;
      (J->fold).ins.field_0.op2 = local_16;
      local_10 = J;
      scev._20_4_ = lj_opt_fold(J);
      *_ev = scev._20_4_;
      _ev[3] = scev._20_4_;
      scev.idx._0_1_ = bVar1;
      scev.pc.ptr64._4_2_ = uVar2;
    }
    else {
      rec_for_loop(J,fori,(ScEvEntry *)local_b0,0);
    }
    idx = (TRef)scev.pc.ptr64._4_2_;
    local_90 = (ushort)(byte)scev.idx;
  }
  LVar4 = rec_for_iter(&stop,(cTValue *)tr,tv._4_4_);
  if (LVar4 == LOOPEV_LEAVE) {
    fori_local[0x2b] = (uint)tv + 4;
    *(BCIns **)(fori_local + 0x22) = _ra + 1;
  }
  else {
    fori_local[0x2b] = (uint)tv;
    *(BCIns **)(fori_local + 0x22) = _ra + ((ulong)(*_ra >> 0x10) - 0x7fff);
  }
  lj_snap_add((jit_State *)fori_local);
  J_local._6_2_ = (ushort)(stop << 8) | local_90 | 0x80;
  J_local._4_2_ = (undefined2)*_ev;
  local_50 = fori_local;
  J_local._2_2_ = (undefined2)idx;
  *(ushort *)(fori_local + 0x2f) = J_local._6_2_;
  *(undefined2 *)(fori_local + 0x2e) = J_local._4_2_;
  *(undefined2 *)((long)fori_local + 0xba) = J_local._2_2_;
  lj_opt_fold((jit_State *)fori_local);
  if (LVar4 == LOOPEV_LEAVE) {
    fori_local[0x2b] = (uint)tv;
    *(BCIns **)(fori_local + 0x22) = _ra + ((ulong)(*_ra >> 0x10) - 0x7fff);
  }
  else {
    fori_local[0x2b] = (uint)tv + 4;
    *(BCIns **)(fori_local + 0x22) = _ra + 1;
  }
  *(undefined1 *)((long)fori_local + 0xb5) = 1;
  return LVar4;
}

Assistant:

static LoopEvent rec_for(jit_State *J, const BCIns *fori, int isforl)
{
  BCReg ra = bc_a(*fori);
  TValue *tv = &J->L->base[ra];
  TRef *tr = &J->base[ra];
  IROp op;
  LoopEvent ev;
  TRef stop;
  IRType t;
  if (isforl) {  /* Handle FORL/JFORL opcodes. */
    TRef idx = tr[FORL_IDX];
    if (mref(J->scev.pc, const BCIns) == fori && tref_ref(idx) == J->scev.idx) {
      t = J->scev.t.irt;
      stop = J->scev.stop;
      idx = emitir(IRT(IR_ADD, t), idx, J->scev.step);
      tr[FORL_EXT] = tr[FORL_IDX] = idx;
    } else {
      ScEvEntry scev;
      rec_for_loop(J, fori, &scev, 0);
      t = scev.t.irt;
      stop = scev.stop;
    }
  } else {  /* Handle FORI/JFORI opcodes. */
    BCReg i;
    lj_meta_for(J->L, tv);
    t = (LJ_DUALNUM || tref_isint(tr[FORL_IDX])) ? lj_opt_narrow_forl(J, tv) :
						   IRT_NUM;
    for (i = FORL_IDX; i <= FORL_STEP; i++) {
      if (!tr[i]) sload(J, ra+i);
      lj_assertJ(tref_isnumber_str(tr[i]), "bad FORI argument type");
      if (tref_isstr(tr[i]))
	tr[i] = emitir(IRTG(IR_STRTO, IRT_NUM), tr[i], 0);
      if (t == IRT_INT) {
	if (!tref_isinteger(tr[i]))
	  tr[i] = emitir(IRTGI(IR_CONV), tr[i], IRCONV_INT_NUM|IRCONV_CHECK);
      } else {
	if (!tref_isnum(tr[i]))
	  tr[i] = emitir(IRTN(IR_CONV), tr[i], IRCONV_NUM_INT);
      }
    }
    tr[FORL_EXT] = tr[FORL_IDX];
    stop = tr[FORL_STOP];
    rec_for_check(J, t, rec_for_direction(&tv[FORL_STEP]),
		  stop, tr[FORL_STEP], 1);
  }

  ev = rec_for_iter(&op, tv, isforl);
  if (ev == LOOPEV_LEAVE) {
    J->maxslot = ra+FORL_EXT+1;
    J->pc = fori+1;
  } else {
    J->maxslot = ra;
    J->pc = fori+bc_j(*fori)+1;
  }
  lj_snap_add(J);

  emitir(IRTG(op, t), tr[FORL_IDX], stop);

  if (ev == LOOPEV_LEAVE) {
    J->maxslot = ra;
    J->pc = fori+bc_j(*fori)+1;
  } else {
    J->maxslot = ra+FORL_EXT+1;
    J->pc = fori+1;
  }
  J->needsnap = 1;
  return ev;
}